

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

float64 vector_sum_norm(float32 *vec,int32 len)

{
  ulong uVar1;
  double dVar2;
  
  if (0 < len) {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + (double)(float)vec[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
    if (((dVar2 != 0.0) || (NAN(dVar2))) && (0 < len)) {
      uVar1 = 0;
      do {
        vec[uVar1] = (float32)(float)((double)(float)vec[uVar1] * (1.0 / dVar2));
        uVar1 = uVar1 + 1;
      } while ((uint)len != uVar1);
    }
    return (float64)dVar2;
  }
  return 0.0;
}

Assistant:

float64 vector_sum_norm (float32 *vec, int32 len)
{
    float64 sum, f;
    int32 i;
    
    sum = 0.0;
    for (i = 0; i < len; i++)
	sum += vec[i];

    if (sum != 0.0) {
	f = 1.0 / sum;
	for (i = 0; i < len; i++)
	    vec[i] *= f;
    }
    
    return sum;
}